

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall
aalcalc::outputresultscsv_new<aal_rec>
          (aalcalc *this,vector<aal_rec,_std::allocator<aal_rec>_> *vec_aal,int sample_size)

{
  uint uVar1;
  bool bVar2;
  int p1_00;
  int iVar3;
  pointer paVar4;
  reference record;
  size_type sVar5;
  int local_105c;
  char local_1058 [4];
  int strLen;
  char buffer [4096];
  double dStack_48;
  int bufferSize;
  double sd_dev;
  double mean;
  __normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_> local_30;
  iterator v_iter;
  int p2;
  int p1;
  int sample_size_local;
  vector<aal_rec,_std::allocator<aal_rec>_> *vec_aal_local;
  aalcalc *this_local;
  
  p1_00 = this->no_of_periods_ * sample_size;
  v_iter._M_current._4_4_ = p1_00 + -1;
  local_30._M_current = (aal_rec *)std::vector<aal_rec,_std::allocator<aal_rec>_>::begin(vec_aal);
  while( true ) {
    mean = (double)std::vector<aal_rec,_std::allocator<aal_rec>_>::end(vec_aal);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>
                        *)&mean);
    if (!bVar2) break;
    paVar4 = __gnu_cxx::
             __normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>::
             operator->(&local_30);
    if (0 < paVar4->summary_id) {
      record = __gnu_cxx::
               __normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>::
               operator*(&local_30);
      calculatemeansddev<aal_rec>
                (this,record,sample_size,p1_00,v_iter._M_current._4_4_,this->no_of_periods_,&sd_dev,
                 &stack0xffffffffffffffb8);
      paVar4 = __gnu_cxx::
               __normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>::
               operator->(&local_30);
      uVar1 = paVar4->summary_id;
      paVar4 = __gnu_cxx::
               __normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>::
               operator->(&local_30);
      local_105c = snprintf(local_1058,0x1000,"%d,%d,%f,%f",sd_dev,dStack_48,(ulong)uVar1,
                            (ulong)(uint)paVar4->type);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->sidxtoensemble_);
      if (sVar5 != 0) {
        iVar3 = snprintf(local_1058 + local_105c,(long)(0x1000 - local_105c),",0");
        local_105c = iVar3 + local_105c;
      }
      iVar3 = snprintf(local_1058 + local_105c,(long)(0x1000 - local_105c),"\n");
      outputrows(this,local_1058,iVar3 + local_105c,_stdout);
    }
    __gnu_cxx::__normal_iterator<aal_rec_*,_std::vector<aal_rec,_std::allocator<aal_rec>_>_>::
    operator++(&local_30,0);
  }
  return;
}

Assistant:

void aalcalc::outputresultscsv_new(std::vector<aal_rec_T>& vec_aal,
				   int sample_size)
{
	int p1 = no_of_periods_ * sample_size;
	int p2 = p1 - 1;

	auto v_iter = vec_aal.begin();
	while (v_iter != vec_aal.end()) {
		if (v_iter->summary_id > 0) {
			double mean, sd_dev;
			calculatemeansddev(*v_iter, sample_size, p1, p2,
					   no_of_periods_, mean, sd_dev);

			const int bufferSize = 4096;
			char buffer[bufferSize];
			int strLen;
			strLen = snprintf(buffer, bufferSize, "%d,%d,%f,%f",
					  v_iter->summary_id, v_iter->type,
					  mean, sd_dev);
			// If relevant use ensemble ID = 0 for calculations
			// across all ensembles
			if (sidxtoensemble_.size() > 0)
				strLen += snprintf(buffer+strLen, bufferSize-strLen, ",0");
			strLen += snprintf(buffer+strLen, bufferSize-strLen, "\n");
			outputrows(buffer, strLen);
		}
		v_iter++;
	}
}